

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  int *piVar1;
  u8 uVar2;
  VTable **ppVVar3;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var4;
  Btree *pBVar5;
  Pager *pPVar6;
  sqlite3_vfs *pVfs;
  long lVar7;
  char *__s;
  bool bVar8;
  sqlite3_file *p_00;
  int iVar9;
  int iVar10;
  Db *pDVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  sqlite3_file *pMaster;
  u32 iRandom;
  int res;
  sqlite3_file *local_40;
  uint local_38;
  int local_34;
  
  ppVVar3 = db->aVTrans;
  db->aVTrans = (VTable **)0x0;
  lVar16 = 0;
  while (lVar16 < db->nVTrans) {
    pVtab = ppVVar3[lVar16]->pVtab;
    iVar9 = 0;
    if ((pVtab != (sqlite3_vtab *)0x0) &&
       (p_Var4 = pVtab->pModule->xSync, p_Var4 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
      iVar9 = (*p_Var4)(pVtab);
      sqlite3VtabImportErrmsg(p,pVtab);
    }
    lVar16 = lVar16 + 1;
    if (iVar9 != 0) {
      db->aVTrans = ppVVar3;
      return iVar9;
    }
  }
  db->aVTrans = ppVVar3;
  lVar16 = 0;
  lVar17 = -1;
  iVar9 = 0;
  bVar8 = false;
  while (lVar17 = lVar17 + 1, lVar17 < db->nDb) {
    pDVar11 = db->aDb;
    pBVar5 = *(Btree **)((long)&pDVar11->pBt + lVar16);
    iVar10 = 0;
    if ((pBVar5 != (Btree *)0x0) && (pBVar5->inTrans == '\x02')) {
      if ((pBVar5->sharable != '\0') &&
         (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
        btreeLockCarefully(pBVar5);
        pDVar11 = db->aDb;
      }
      pPVar6 = pBVar5->pBt->pPager;
      if (((&pDVar11->safety_level)[lVar16] != '\x01') &&
         ((0x34UL >> ((ulong)pPVar6->journalMode & 0x3f) & 1) == 0)) {
        iVar9 = iVar9 + (uint)(pPVar6->tempFile == '\0');
      }
      iVar10 = sqlite3PagerExclusiveLock(pPVar6);
      bVar8 = true;
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
    }
    lVar16 = lVar16 + 0x20;
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  if (((bVar8) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) &&
     (iVar10 = (*db->xCommitCallback)(db->pCommitArg), iVar10 != 0)) {
    return 0x213;
  }
  pPVar6 = db->aDb->pBt->pBt->pPager;
  uVar2 = pPVar6->memDb;
  if (uVar2 == '\0') {
    pcVar13 = pPVar6->zFilename;
    if (pcVar13 != (char *)0x0) goto LAB_0014a7d7;
  }
  else {
    pcVar13 = "";
LAB_0014a7d7:
    sVar12 = strlen(pcVar13);
    if (((sVar12 & 0x3fffffff) != 0) && (1 < iVar9)) {
      pVfs = db->pVfs;
      if (uVar2 == '\0') {
        pcVar13 = pPVar6->zFilename;
        local_40 = (sqlite3_file *)0x0;
        if (pcVar13 != (char *)0x0) goto LAB_0014a8a6;
        pcVar13 = (char *)0x0;
        uVar14 = 0;
      }
      else {
        pcVar13 = "";
LAB_0014a8a6:
        local_40 = (sqlite3_file *)0x0;
        sVar12 = strlen(pcVar13);
        uVar14 = (ulong)((uint)sVar12 & 0x3fffffff);
      }
      pcVar13 = sqlite3MPrintf(db,"%s-mjXXXXXX9XXz",pcVar13);
      if (pcVar13 == (char *)0x0) {
        return 7;
      }
      uVar15 = 0;
      do {
        if (uVar15 != 0) {
          if (100 < uVar15) {
            sqlite3_log(0xd,"MJ delete: %s",pcVar13);
            (*pVfs->xDelete)(pVfs,pcVar13,0);
            goto LAB_0014a9a3;
          }
          if (uVar15 == 1) {
            sqlite3_log(0xd,"MJ collide: %s",pcVar13);
          }
        }
        sqlite3_randomness(4,&local_38);
        sqlite3_snprintf(0xd,pcVar13 + uVar14,"-mj%06X9%02X",(ulong)(local_38 >> 8));
        iVar9 = (*pVfs->xAccess)(pVfs,pcVar13,0,&local_34);
      } while ((iVar9 == 0) && (uVar15 = uVar15 + 1, local_34 != 0));
      if (iVar9 != 0) {
LAB_0014a9c2:
        sqlite3DbFreeNN(db,pcVar13);
        return iVar9;
      }
LAB_0014a9a3:
      iVar9 = sqlite3OsOpenMalloc(pVfs,pcVar13,&local_40,0x4016,(int *)0x0);
      p_00 = local_40;
      if (iVar9 != 0) goto LAB_0014a9c2;
      iVar9 = db->nDb;
      if (0 < iVar9) {
        lVar18 = 8;
        lVar16 = 0;
        lVar17 = 0;
        do {
          lVar7 = *(long *)((long)&db->aDb->zDbSName + lVar18);
          if (((lVar7 != 0) && (*(char *)(lVar7 + 0x10) == '\x02')) &&
             (__s = *(char **)(**(long **)(lVar7 + 8) + 0xd8), __s != (char *)0x0)) {
            sVar12 = strlen(__s);
            iVar9 = (*p_00->pMethods->xWrite)(p_00,__s,((uint)sVar12 & 0x3fffffff) + 1,lVar17);
            if (iVar9 != 0) goto LAB_0014abac;
            sVar12 = strlen(__s);
            lVar17 = lVar17 + (ulong)((uint)sVar12 & 0x3fffffff) + 1;
            iVar9 = db->nDb;
          }
          lVar16 = lVar16 + 1;
          lVar18 = lVar18 + 0x20;
        } while (lVar16 < iVar9);
      }
      uVar15 = (*p_00->pMethods->xDeviceCharacteristics)(p_00);
      if (((uVar15 >> 10 & 1) == 0) && (iVar9 = (*p_00->pMethods->xSync)(p_00,2), iVar9 != 0)) {
LAB_0014abac:
        if (p_00->pMethods != (sqlite3_io_methods *)0x0) {
          (*p_00->pMethods->xClose)(p_00);
          p_00->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(p_00);
        (*pVfs->xDelete)(pVfs,pcVar13,0);
        goto LAB_0014a9c2;
      }
      lVar17 = -1;
      lVar16 = 8;
      do {
        iVar10 = db->nDb;
        lVar17 = lVar17 + 1;
        if (iVar10 <= lVar17) {
          iVar9 = 0;
          break;
        }
        pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar16);
        if (pBVar5 == (Btree *)0x0) {
          iVar9 = 0;
        }
        else {
          iVar9 = sqlite3BtreeCommitPhaseOne(pBVar5,pcVar13);
        }
        lVar16 = lVar16 + 0x20;
      } while (iVar9 == 0);
      if (p_00->pMethods != (sqlite3_io_methods *)0x0) {
        (*p_00->pMethods->xClose)(p_00);
        p_00->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(p_00);
      if (lVar17 < iVar10) goto LAB_0014a9c2;
      iVar9 = (*pVfs->xDelete)(pVfs,pcVar13,1);
      sqlite3DbFreeNN(db,pcVar13);
      if (iVar9 != 0) {
        return iVar9;
      }
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      iVar9 = db->nDb;
      if (0 < iVar9) {
        lVar16 = 8;
        lVar17 = 0;
        do {
          pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar16);
          if (pBVar5 != (Btree *)0x0) {
            sqlite3BtreeCommitPhaseTwo(pBVar5,1);
            iVar9 = db->nDb;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x20;
        } while (lVar17 < iVar9);
      }
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      goto LAB_0014ab85;
    }
  }
  lVar16 = -1;
  lVar17 = 8;
  while (lVar16 = lVar16 + 1, lVar16 < db->nDb) {
    pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar17);
    if (pBVar5 == (Btree *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = sqlite3BtreeCommitPhaseOne(pBVar5,(char *)0x0);
    }
    lVar17 = lVar17 + 0x20;
    if (iVar9 != 0) {
      return iVar9;
    }
  }
  lVar16 = -1;
  lVar17 = 8;
  while (lVar16 = lVar16 + 1, lVar16 < db->nDb) {
    pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar17);
    if (pBVar5 == (Btree *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = sqlite3BtreeCommitPhaseTwo(pBVar5,0);
    }
    lVar17 = lVar17 + 0x20;
    if (iVar9 != 0) {
      return iVar9;
    }
  }
LAB_0014ab85:
  callFinaliser(db,0x80);
  return 0;
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction
                   ** that are candidates for a two-phase commit using a
                   ** master-journal */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply 
  ** SQLITE_OK so p is not used. 
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a master journal file is 
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, p);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not 
  ** including the temp database. (b) is important because if more than 
  ** one database file has an open write transaction, a master journal
  ** file is required for an atomic commit.
  */ 
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeIsInTrans(pBt) ){
      /* Whether or not a database might need a master journal depends upon
      ** its journal mode (among other things).  This matrix determines which
      ** journal modes use a master journal and which do not */
      static const u8 aMJNeeded[] = {
        /* DELETE   */  1,
        /* PERSIST   */ 1,
        /* OFF       */ 0,
        /* TRUNCATE  */ 1,
        /* MEMORY    */ 0,
        /* WAL       */ 0
      };
      Pager *pPager;   /* Pager associated with pBt */
      needXcommit = 1;
      sqlite3BtreeEnter(pBt);
      pPager = sqlite3BtreePager(pBt);
      if( db->aDb[i].safety_level!=PAGER_SYNCHRONOUS_OFF
       && aMJNeeded[sqlite3PagerGetJournalMode(pPager)]
       && sqlite3PagerIsMemdb(pPager)==0
      ){ 
        assert( i!=1 );
        nTrans++;
      }
      rc = sqlite3PagerExclusiveLock(pPager);
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** master-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In 
  ** that case we do not support atomic multi-file commits, so use the 
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1. 
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a master journal file to ensure the transaction is
  ** committed atomically.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    char *zMaster = 0;   /* File-name for the master journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pMaster = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a master journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zMaster = sqlite3MPrintf(db, "%s-mjXXXXXX9XXz", zMainFile);
    if( zMaster==0 ) return SQLITE_NOMEM_BKPT;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zMaster);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zMaster[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the master journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zMaster[sqlite3Strlen30(zMaster)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zMaster);
      rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the master journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zMaster, &pMaster, 
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_MASTER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }
 
    /* Write the name of each database file in the transaction into the new
    ** master journal file. If an error occurs at this point close
    ** and delete the master journal file. All the individual journal files
    ** still have 'null' as the master journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeIsInTrans(pBt) ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        rc = sqlite3OsWrite(pMaster, zFile, sqlite3Strlen30(zFile)+1, offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          sqlite3DbFree(db, zMaster);
          return rc;
        }
      }
    }

    /* Sync the master journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( 0==(sqlite3OsDeviceCharacteristics(pMaster)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pMaster, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pMaster);
      sqlite3OsDelete(pVfs, zMaster, 0);
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the master journal pointer in each individual journal. If
    ** an error occurs here, do not delete the master journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** master journal file will be orphaned. But we cannot delete it,
    ** in case the master journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zMaster);
      }
    }
    sqlite3OsCloseFree(pMaster);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Delete the master journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zMaster, 1);
    sqlite3DbFree(db, zMaster);
    zMaster = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}